

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void nni_stat_init_lock(nni_stat_item *item,nni_stat_info *info,nni_mtx *mtx)

{
  item->si_mtx = (nni_mtx *)0x0;
  (item->si_u).sv_number = 0;
  (item->si_children).ll_offset = 0;
  item->si_info = (nni_stat_info *)0x0;
  (item->si_children).ll_head.ln_next = (nni_list_node *)0x0;
  (item->si_children).ll_head.ln_prev = (nni_list_node *)0x0;
  (item->si_node).ln_next = (nni_list_node *)0x0;
  (item->si_node).ln_prev = (nni_list_node *)0x0;
  nni_list_init_offset(&item->si_children,0);
  item->si_info = info;
  item->si_mtx = mtx;
  return;
}

Assistant:

void
nni_stat_init_lock(
    nni_stat_item *item, const nni_stat_info *info, nni_mtx *mtx)
{
#ifdef NNG_ENABLE_STATS
	memset(item, 0, sizeof(*item));
	NNI_LIST_INIT(&item->si_children, nni_stat_item, si_node);
	item->si_info = info;
	item->si_mtx  = mtx;
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(info);
	NNI_ARG_UNUSED(mtx);
#endif
}